

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

void __thiscall ActionQueue::~ActionQueue(ActionQueue *this)

{
  bool bVar1;
  ActionQueue *this_local;
  
  while( true ) {
    bVar1 = std::
            queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
            ::empty(&this->queue);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
    ::pop(&this->queue);
  }
  std::
  queue<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>_>
  ::~queue(&this->queue);
  return;
}

Assistant:

ActionQueue::~ActionQueue()
{
	while (!this->queue.empty())
	{
		this->queue.pop();
	}
}